

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_helpers.cc
# Opt level: O2

int google::protobuf::compiler::java::GetExperimentalJavaFieldType(FieldDescriptor *field)

{
  FieldDescriptor FVar1;
  byte bVar2;
  bool bVar3;
  char cVar4;
  JavaType JVar5;
  int iVar6;
  Descriptor *type;
  FieldDescriptor *pFVar7;
  LogMessage *this;
  uint uVar8;
  uint uVar9;
  LogMessageFatal aLStack_28 [16];
  
  bVar2 = google::protobuf::FieldDescriptor::is_required();
  uVar8 = (uint)bVar2 * 0x100;
  uVar9 = uVar8;
  if (field[2] == (FieldDescriptor)0x9) {
    bVar3 = CheckUtf8(field);
    uVar9 = uVar8 + 0x200;
    if (!bVar3) {
      uVar9 = uVar8;
    }
  }
  cVar4 = google::protobuf::FieldDescriptor::is_required();
  if (cVar4 == '\0') {
    JVar5 = GetJavaType(field);
    if (JVar5 != JAVATYPE_MESSAGE) goto LAB_0022c978;
    type = (Descriptor *)google::protobuf::FieldDescriptor::message_type();
    bVar3 = HasRequiredFields(type);
    if (!bVar3) goto LAB_0022c978;
  }
  uVar9 = uVar9 | 0x400;
LAB_0022c978:
  cVar4 = google::protobuf::internal::cpp::HasHasbit(field);
  uVar8 = uVar9 + 0x1000;
  if (cVar4 == '\0') {
    uVar8 = uVar9;
  }
  JVar5 = GetJavaType(field);
  if (JVar5 == JAVATYPE_ENUM) {
    bVar3 = SupportUnknownEnumValue(field);
    if (!bVar3) {
      uVar8 = uVar8 | 0x800;
    }
  }
  bVar3 = FieldDescriptor::is_map(field);
  if (bVar3) {
    pFVar7 = MapValueField(field);
    bVar3 = SupportUnknownEnumValue(pFVar7);
    if (!bVar3) {
      google::protobuf::FieldDescriptor::message_type();
      pFVar7 = (FieldDescriptor *)google::protobuf::Descriptor::map_value();
      JVar5 = GetJavaType(pFVar7);
      if (JVar5 == JAVATYPE_ENUM) {
        uVar8 = uVar8 | 0x800;
      }
    }
    uVar8 = uVar8 | 0x32;
  }
  else {
    cVar4 = google::protobuf::FieldDescriptor::is_packed();
    if (cVar4 == '\0') {
      bVar3 = FieldDescriptor::is_repeated(field);
      if (bVar3) {
        FVar1 = field[2];
        uVar9 = 0x31;
        if (FVar1 != (FieldDescriptor)0xa) {
          uVar9 = (byte)FVar1 + 0x12 + ((byte)FVar1 < 10 | 0xfffffffe);
        }
      }
      else {
        bVar3 = IsRealOneof(field);
        FVar1 = field[2];
        uVar9 = (uint)(byte)FVar1;
        if (bVar3) {
          if (uVar9 == 10) {
            iVar6 = 0x11;
          }
          else if ((byte)FVar1 < 10) {
            iVar6 = uVar9 - 1;
          }
          else {
            iVar6 = uVar9 - 2;
          }
          uVar9 = iVar6 + 0x33;
        }
        else if (uVar9 == 10) {
          uVar9 = 0x11;
        }
        else if ((byte)FVar1 < 10) {
          uVar9 = uVar9 - 1;
        }
        else {
          uVar9 = uVar9 - 2;
        }
      }
    }
    else {
      FVar1 = field[2];
      if ((byte)FVar1 < 9) {
        iVar6 = 0x22;
      }
      else {
        if ((byte)FVar1 < 0xd) {
          absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                    (aLStack_28,
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/compiler/java/internal_helpers.cc"
                     ,0x47);
          this = (LogMessage *)
                 absl::lts_20240722::log_internal::LogMessage::operator<<
                           ((LogMessage *)aLStack_28,(string *)(*(long *)(field + 8) + 0x20));
          absl::lts_20240722::log_internal::LogMessage::operator<<
                    (this,(char (*) [18])" can\'t be packed.");
          absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(aLStack_28);
        }
        iVar6 = 0x1e;
      }
      uVar9 = iVar6 + (uint)(byte)FVar1;
    }
    uVar8 = uVar9 | uVar8;
  }
  return uVar8;
}

Assistant:

int GetExperimentalJavaFieldType(const FieldDescriptor* field) {
  static const int kMapFieldType = 50;
  static const int kOneofFieldTypeOffset = 51;

  static const int kRequiredBit = 0x100;
  static const int kUtf8CheckBit = 0x200;
  static const int kCheckInitialized = 0x400;
  static const int kLegacyEnumIsClosedBit = 0x800;
  static const int kHasHasBit = 0x1000;
  int extra_bits = field->is_required() ? kRequiredBit : 0;
  if (field->type() == FieldDescriptor::TYPE_STRING && CheckUtf8(field)) {
    extra_bits |= kUtf8CheckBit;
  }
  if (field->is_required() || (GetJavaType(field) == JAVATYPE_MESSAGE &&
                               HasRequiredFields(field->message_type()))) {
    extra_bits |= kCheckInitialized;
  }
  if (HasHasbit(field)) {
    extra_bits |= kHasHasBit;
  }
  if (GetJavaType(field) == JAVATYPE_ENUM && !SupportUnknownEnumValue(field)) {
    extra_bits |= kLegacyEnumIsClosedBit;
  }

  if (field->is_map()) {
    if (!SupportUnknownEnumValue(MapValueField(field))) {
      const FieldDescriptor* value = field->message_type()->map_value();
      if (GetJavaType(value) == JAVATYPE_ENUM) {
        extra_bits |= kLegacyEnumIsClosedBit;
      }
    }
    return kMapFieldType | extra_bits;
  } else if (field->is_packed()) {
    return GetExperimentalJavaFieldTypeForPacked(field) | extra_bits;
  } else if (field->is_repeated()) {
    return GetExperimentalJavaFieldTypeForRepeated(field) | extra_bits;
  } else if (IsRealOneof(field)) {
    return (GetExperimentalJavaFieldTypeForSingular(field) +
            kOneofFieldTypeOffset) |
           extra_bits;
  } else {
    return GetExperimentalJavaFieldTypeForSingular(field) | extra_bits;
  }
}